

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmuni.h
# Opt level: O2

int CVmCaseFoldStr::wstreq(wchar_t *a,wchar_t *b)

{
  wchar_t wVar1;
  wchar_t wVar2;
  int unaff_EBP;
  CVmCaseFoldStr fb;
  CVmCaseFoldStr fa;
  
  fa.rem = wcslen(a);
  fa.fpbase = fa.ie;
  fa.fp = fa.ie + 1;
  fa.ie[1] = L'\0';
  fa.p = a;
  fb.rem = wcslen(b);
  fb.fpbase = fb.ie;
  fb.fp = fb.ie + 1;
  fb.ie[1] = L'\0';
  fb.p = b;
  do {
    wVar1 = getch(&fa);
    wVar2 = getch(&fb);
    if (wVar1 == L'\0') {
      unaff_EBP = 1;
    }
    if (wVar1 != wVar2) {
      unaff_EBP = 0;
    }
  } while ((wVar1 != L'\0') && (wVar1 == wVar2));
  return unaff_EBP;
}

Assistant:

static int wstreq(const wchar_t *a, const wchar_t *b)
    {
        /* loop over characters until we find a mismatch */
        for (CVmCaseFoldStr fa(a), fb(b) ; ; )
        {
            /* get the next character of each folded string */
            wchar_t ca = fa.getch();
            wchar_t cb = fb.getch();
            
            /* if they differ, return not equal */
            if (ca != cb)
                return FALSE;
            
            /* if they both ended here, we have a match */
            if (ca == 0)
                return TRUE;
        }
    }